

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

bool __thiscall
GEO::PeriodicDelaunay3dThread::get_neighbor_along_conflict_zone_border
          (PeriodicDelaunay3dThread *this,index_t t1,index_t t1fborder,index_t t1ft2,index_t *t2,
          index_t *t2fborder,index_t *t2ft1)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  index_t iVar5;
  pointer piVar6;
  pointer piVar7;
  ulong uVar8;
  ulong uVar9;
  
  piVar6 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar6[(int)(char)halfedge_facet_[(ulong)t1fborder + (ulong)t1ft2 * 4] + t1 * 4];
  iVar3 = piVar6[(int)(char)halfedge_facet_[(ulong)t1ft2 + (ulong)t1fborder * 4] + t1 * 4];
  piVar7 = (this->cell_to_cell_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = piVar7[t1ft2 + t1 * 4];
  while (((this->cell_thread_->
          super_vector<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>).
          super__Vector_base<unsigned_char,_GEO::Memory::aligned_allocator<unsigned_char,_64>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar4] & 1) != 0) {
    uVar8 = (ulong)(uVar4 * 4);
    t1ft2 = (index_t)(char)halfedge_facet_
                           [((ulong)(piVar6[uVar8 + 3] == iVar3) * 3 |
                            (ulong)(piVar6[uVar8 + 1] == iVar3) +
                            (ulong)(piVar6[uVar8 + 2] == iVar3) * 2) +
                            (ulong)((uint)(piVar6[uVar8 + 3] == iVar2) * 3 |
                                   (uint)(piVar6[uVar8 + 1] == iVar2) +
                                   (uint)(piVar6[uVar8 + 2] == iVar2) * 2) * 4];
    t1 = uVar4;
    uVar4 = piVar7[t1ft2 + uVar4 * 4];
  }
  uVar8 = (ulong)(uVar4 * 4);
  uVar9 = (ulong)(piVar6[uVar8 + 3] == iVar2) * 3 |
          (ulong)(piVar6[uVar8 + 2] == iVar2) * 2 + (ulong)(piVar6[uVar8 + 1] == iVar2);
  uVar8 = (ulong)(piVar6[uVar8 + 3] == iVar3) * 3 |
          (ulong)(piVar6[uVar8 + 1] == iVar3) + (ulong)(piVar6[uVar8 + 2] == iVar3) * 2;
  cVar1 = halfedge_facet_[uVar8 + uVar9 * 4];
  iVar5 = piVar7[(int)(char)halfedge_facet_[uVar9 + uVar8 * 4] + uVar4 * 4];
  *t2 = iVar5;
  iVar2 = piVar6[(int)cVar1 + uVar4 * 4];
  uVar8 = (ulong)(iVar5 << 2);
  *t2ft1 = (uint)(piVar6[uVar8 + 3] == iVar2) * 3 |
           (uint)(piVar6[uVar8 + 1] == iVar2) + (uint)(piVar6[uVar8 + 2] == iVar2) * 2;
  *t2fborder = t1ft2;
  return *t2 != t1;
}

Assistant:

bool get_neighbor_along_conflict_zone_border(
            index_t t1,
            index_t t1fborder,
            index_t t1ft2,
            index_t& t2,
            index_t& t2fborder,
            index_t& t2ft1
        ) const {
            
            // Note: this function is a bit long for an inline function,
            // but I observed a (modest) performance gain doing so.
            
            //   Find two vertices that are both on facets new_f and f1
            //  (the edge around which we are turning)
            //  This uses duality as follows:
            //  Primal form (not used here): 
            //    halfedge_facet_[v1][v2] returns a facet that is incident
            //    to both v1 and v2.
            //  Dual form (used here):
            //    halfedge_facet_[f1][f2] returns a vertex that both 
            //    f1 and f2 are incident to.
            signed_index_t ev1 = 
                tet_vertex(t1, index_t(halfedge_facet_[t1ft2][t1fborder]));
            signed_index_t ev2 = 
                tet_vertex(t1, index_t(halfedge_facet_[t1fborder][t1ft2]));
            
            //   Turn around edge [ev1,ev2] inside the conflict zone
            // until we reach again the boundary of the conflict zone.
            // Traversing inside the conflict zone is faster (as compared
            // to outside) since it traverses a smaller number of tets.
            index_t cur_t = t1;
            index_t cur_f = t1ft2;
            index_t next_t = index_t(tet_adjacent(cur_t,cur_f));
            while(tet_is_marked_as_conflict(next_t)) {            
                geo_debug_assert(next_t != t1);
                cur_t = next_t;
                cur_f = get_facet_by_halfedge(cur_t,ev1,ev2);
                next_t = index_t(tet_adjacent(cur_t, cur_f));
            }
             
            //  At this point, cur_t is in conflict zone and
            // next_t is outside the conflict zone.
            index_t f12,f21;
            get_facets_by_halfedge(next_t, ev1, ev2, f12, f21);
            t2 = index_t(tet_adjacent(next_t,f21));
            signed_index_t v_neigh_opposite = tet_vertex(next_t,f12);
            t2ft1 = find_tet_vertex(t2, v_neigh_opposite);
            t2fborder = cur_f;
            
            //  Test whether the found neighboring tet was created
            //  (then return true) or is an old tet in conflict
            //  (then return false).
            return(t2 != cur_t);
        }